

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  int iVar1;
  time_t start_time;
  LIBSSH2_SFTP *pLVar2;
  int rc;
  time_t entry_time;
  LIBSSH2_SFTP *ptr;
  LIBSSH2_SESSION *session_local;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 4U) == 0) {
      _libssh2_error(session,-0x22,"session not authenticated yet");
    }
    else {
      start_time = time((time_t *)0x0);
      do {
        pLVar2 = sftp_init(session);
        if (session->api_block_mode == 0) {
          return pLVar2;
        }
        if (pLVar2 != (LIBSSH2_SFTP *)0x0) {
          return pLVar2;
        }
        iVar1 = libssh2_session_last_errno(session);
        if (iVar1 != -0x25) {
          return (LIBSSH2_SFTP *)0x0;
        }
        iVar1 = _libssh2_wait_socket(session,start_time);
      } while (iVar1 == 0);
    }
  }
  return (LIBSSH2_SFTP *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}